

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator_target.hpp
# Opt level: O2

bool __thiscall
ruckig::TargetCalculator<3UL,_ruckig::StandardVector>::is_input_collinear
          (TargetCalculator<3UL,_ruckig::StandardVector> *this,
          InputParameter<3UL,_ruckig::StandardVector> *inp,Direction limiting_direction,
          size_t limiting_dof)

{
  Vector<double> *pVVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  size_t sVar7;
  Vector<double> *pVVar8;
  size_t dof;
  size_t sVar9;
  StandardVector<double,_3UL> *pSVar10;
  Vector<double> *pVVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  sVar7 = this->degrees_of_freedom;
  pVVar11 = &this->pd;
  for (sVar9 = 0; sVar7 != sVar9; sVar9 = sVar9 + 1) {
    pVVar11->_M_elems[sVar9] =
         (inp->target_position)._M_elems[sVar9] - (inp->current_position)._M_elems[sVar9];
  }
  pVVar1 = &inp->current_velocity;
  sVar9 = 0;
  do {
    if (sVar7 == sVar9) {
      return false;
    }
    if ((this->inp_per_dof_synchronization)._M_elems[sVar9] == Phase) {
      if (((this->inp_per_dof_control_interface)._M_elems[sVar9] == Position) &&
         (dVar14 = (this->pd)._M_elems[sVar9], 2.220446049250313e-16 < ABS(dVar14))) {
        dVar13 = pVVar1->_M_elems[sVar9];
        dVar16 = dVar14;
LAB_00118b7f:
        dVar2 = (inp->max_jerk)._M_elems[limiting_dof];
        dVar15 = dVar2;
        if (limiting_direction != UP) {
          dVar15 = (double)((ulong)dVar2 ^ (ulong)DAT_0011c080);
        }
        dVar3 = (inp->current_acceleration)._M_elems[sVar9];
        dVar4 = (inp->target_velocity)._M_elems[sVar9];
        dVar5 = (inp->target_acceleration)._M_elems[sVar9];
        if (ABS(dVar2) == INFINITY) {
          pSVar10 = &this->inp_min_acceleration;
          if (limiting_direction == UP) {
            pSVar10 = &inp->max_acceleration;
          }
          dVar15 = pSVar10->_M_elems[limiting_dof];
        }
        dVar2 = pVVar11->_M_elems[limiting_dof];
        sVar9 = 0;
        do {
          bVar12 = sVar7 == sVar9;
          if (bVar12) {
            return bVar12;
          }
          if ((this->inp_per_dof_synchronization)._M_elems[sVar9] == Phase) {
            dVar6 = pVVar11->_M_elems[sVar9];
            if (((this->inp_per_dof_control_interface)._M_elems[sVar9] == Position) &&
               (2.220446049250313e-16 < ABS((-dVar14 / dVar16) * dVar6 + (this->pd)._M_elems[sVar9])
               )) {
              return bVar12;
            }
            if (2.220446049250313e-16 < ABS((-dVar13 / dVar16) * dVar6 + pVVar1->_M_elems[sVar9])) {
              return bVar12;
            }
            if (2.220446049250313e-16 <
                ABS((-dVar3 / dVar16) * dVar6 + (inp->current_acceleration)._M_elems[sVar9])) {
              return bVar12;
            }
            if (2.220446049250313e-16 <
                ABS((-dVar4 / dVar16) * dVar6 + (inp->target_velocity)._M_elems[sVar9])) {
              return bVar12;
            }
            if (2.220446049250313e-16 <
                ABS((-dVar5 / dVar16) * dVar6 + (inp->target_acceleration)._M_elems[sVar9])) {
              return bVar12;
            }
            (this->new_phase_control)._M_elems[sVar9] = (dVar6 * dVar15) / dVar2;
          }
          sVar9 = sVar9 + 1;
        } while( true );
      }
      dVar13 = pVVar1->_M_elems[sVar9];
      pVVar8 = pVVar1;
      dVar16 = dVar13;
      if ((2.220446049250313e-16 < ABS(dVar13)) ||
         (((dVar16 = (inp->current_acceleration)._M_elems[sVar9],
           pVVar8 = &inp->current_acceleration, 2.220446049250313e-16 < ABS(dVar16) ||
           (dVar16 = (inp->target_velocity)._M_elems[sVar9], pVVar8 = &inp->target_velocity,
           2.220446049250313e-16 < ABS(dVar16))) ||
          (dVar16 = (inp->target_acceleration)._M_elems[sVar9], pVVar8 = &inp->target_acceleration,
          2.220446049250313e-16 < ABS(dVar16))))) {
        pVVar11 = pVVar8;
        dVar14 = (this->pd)._M_elems[sVar9];
        goto LAB_00118b7f;
      }
    }
    sVar9 = sVar9 + 1;
  } while( true );
}

Assistant:

bool is_input_collinear(const InputParameter<DOFs, CustomVector>& inp, Profile::Direction limiting_direction, size_t limiting_dof) {
        // Check that vectors pd, v0, a0, vf, af are collinear
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            pd[dof] = inp.target_position[dof] - inp.current_position[dof];
        }

        const Vector<double>* scale_vector = nullptr;
        std::optional<size_t> scale_dof; // Need to find a scale DOF because limiting DOF might not be phase synchronized
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            if (inp_per_dof_synchronization[dof] != Synchronization::Phase) {
                continue;
            }

            if (inp_per_dof_control_interface[dof] == ControlInterface::Position && std::abs(pd[dof]) > eps) {
                scale_vector = &pd;
                scale_dof = dof;
                break;

            } else if (std::abs(inp.current_velocity[dof]) > eps) {
                scale_vector = &inp.current_velocity;
                scale_dof = dof;
                break;

            } else if (std::abs(inp.current_acceleration[dof]) > eps) {
                scale_vector = &inp.current_acceleration;
                scale_dof = dof;
                break;

            } else if (std::abs(inp.target_velocity[dof]) > eps) {
                scale_vector = &inp.target_velocity;
                scale_dof = dof;
                break;

            } else if (std::abs(inp.target_acceleration[dof]) > eps) {
                scale_vector = &inp.target_acceleration;
                scale_dof = dof;
                break;
            }
        }

        if (!scale_dof) {
            return false; // Zero everywhere is in theory collinear, but that trivial case is better handled elsewhere
        }

        const double scale = scale_vector->operator[](*scale_dof);
        const double pd_scale = pd[*scale_dof] / scale;
        const double v0_scale = inp.current_velocity[*scale_dof] / scale;
        const double vf_scale = inp.target_velocity[*scale_dof] / scale;
        const double a0_scale = inp.current_acceleration[*scale_dof] / scale;
        const double af_scale = inp.target_acceleration[*scale_dof] / scale;

        const double scale_limiting = scale_vector->operator[](limiting_dof);
        double control_limiting = (limiting_direction == Profile::Direction::UP) ? inp.max_jerk[limiting_dof] : -inp.max_jerk[limiting_dof];
        if (std::isinf(inp.max_jerk[limiting_dof])) {
            control_limiting = (limiting_direction == Profile::Direction::UP) ? inp.max_acceleration[limiting_dof] : inp_min_acceleration[limiting_dof];
        }

        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            if (inp_per_dof_synchronization[dof] != Synchronization::Phase) {
                continue;
            }

            const double current_scale = scale_vector->operator[](dof);
            if (
                (inp_per_dof_control_interface[dof] == ControlInterface::Position && std::abs(pd[dof] - pd_scale * current_scale) > eps)
                || std::abs(inp.current_velocity[dof] - v0_scale * current_scale) > eps
                || std::abs(inp.current_acceleration[dof] - a0_scale * current_scale) > eps
                || std::abs(inp.target_velocity[dof] - vf_scale * current_scale) > eps
                || std::abs(inp.target_acceleration[dof] - af_scale * current_scale) > eps
            ) {
                return false;
            }

            new_phase_control[dof] = control_limiting * current_scale / scale_limiting;
        }

        return true;
    }